

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

string * __thiscall
CoreML::dimensionsToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,vector<long,_std::allocator<long>_> *dims,
          bool useArrayFormat)

{
  char *pcVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong local_1e8;
  size_t i;
  allocator local_1c9;
  string local_1c8 [8];
  string separator;
  stringstream ss;
  ostream local_198 [383];
  byte local_19;
  CoreML *pCStack_18;
  bool useArrayFormat_local;
  vector<long,_std::allocator<long>_> *dims_local;
  
  local_19 = (byte)dims & 1;
  pCStack_18 = this;
  dims_local = (vector<long,_std::allocator<long>_> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)(separator.field_2._M_local_buf + 8));
  pcVar1 = anon_var_dwarf_3e690c;
  if ((local_19 & 1) != 0) {
    pcVar1 = ", ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c8,pcVar1,&local_1c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  if ((local_19 & 1) != 0) {
    std::operator<<(local_198,"[");
  }
  local_1e8 = 0;
  while( true ) {
    sVar2 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)pCStack_18);
    if (sVar2 <= local_1e8) break;
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)pCStack_18,local_1e8);
    std::ostream::operator<<(local_198,*pvVar3);
    sVar2 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)pCStack_18);
    if (local_1e8 < sVar2 - 1) {
      std::operator<<(local_198,local_1c8);
    }
    local_1e8 = local_1e8 + 1;
  }
  if ((local_19 & 1) != 0) {
    std::operator<<(local_198,"]");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(separator.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static std::string dimensionsToString(const std::vector<int64_t> &dims, bool useArrayFormat = false) {

        std::stringstream ss;
        std::string separator = useArrayFormat ? ", " : " × ";

        if (useArrayFormat) {
            ss << "[";
        }

        for (size_t i=0; i<dims.size(); i++) {
            ss << dims[i];
            if (i < dims.size() - 1) { ss << separator; }
        }

        if (useArrayFormat) {
            ss << "]";
        }

        return ss.str();
    }